

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall crnlib::mip_level::mip_level(mip_level *this,mip_level *other)

{
  mip_level *other_local;
  mip_level *this_local;
  
  this->m_width = 0;
  this->m_height = 0;
  this->m_comp_flags = cDefaultCompFlags;
  this->m_format = PIXEL_FMT_INVALID;
  this->m_pImage = (image_u8 *)0x0;
  this->m_pDXTImage = (dxt_image *)0x0;
  this->m_orient_flags = cDefaultOrientationFlags;
  operator=(this,other);
  return;
}

Assistant:

mip_level::mip_level(const mip_level& other)
    : m_width(0),
      m_height(0),
      m_comp_flags(pixel_format_helpers::cDefaultCompFlags),
      m_format(PIXEL_FMT_INVALID),
      m_pImage(nullptr),
      m_pDXTImage(nullptr),
      m_orient_flags(cDefaultOrientationFlags) {
  *this = other;
}